

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModelBullet.cpp
# Opt level: O3

void __thiscall
chrono::collision::ChCollisionModelBullet::~ChCollisionModelBullet(ChCollisionModelBullet *this)

{
  ~ChCollisionModelBullet(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

ChCollisionModelBullet::~ChCollisionModelBullet() {}